

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconvert_linux.c
# Opt level: O0

void GetDefault(void)

{
  if (Current == (tchar_t *)0x0) {
    setlocale(6,"");
    Current = setlocale(0,"");
    if (Current != (char *)0x0) {
      Current = strrchr(Current,0x2e);
    }
    if (Current == (tchar_t *)0x0) {
      Current = "";
    }
    else {
      Current = Current + 1;
    }
  }
  return;
}

Assistant:

static NOINLINE void GetDefault(void)
{
    if (!Current)
    {
        setlocale(LC_ALL,""); // set default for all
        Current = setlocale(LC_CTYPE,"");
        if (Current)
            Current = strrchr(Current,'.');
        if (Current)
           ++Current;
        else
           Current = "";
    }
}